

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

Expr __thiscall mp::CallExpr::arg(CallExpr *this,int index)

{
  Impl *pIVar1;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> BVar2;
  AssertionFailure *this_00;
  
  if ((-1 < index) &&
     (pIVar1 = (this->super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>).super_ExprBase.impl_,
     index < (int)pIVar1[4].kind_)) {
    BVar2 = internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                      (*(Impl **)(pIVar1 + (ulong)(uint)index * 2 + 6));
    return (Expr)BVar2.super_ExprBase.impl_;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"index out of bounds");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Expr arg(int index) {
    MP_ASSERT(index >= 0 && index < num_args(), "index out of bounds");
    return Create<Expr>(impl()->args[index]);
  }